

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O2

CECoordinates * __thiscall
CECoordinates::ConvertTo
          (CECoordinates *__return_storage_ptr__,CECoordinates *this,
          CECoordinateType output_coord_type,double jd,double longitude,double latitude,
          double elevation_m,double pressure_hPa,double temperature_celsius,double relative_humidity
          ,double dut1,double xp,double yp,double wavelength_um)

{
  CECoordinates local_48;
  
  CECoordinates(__return_storage_ptr__);
  switch(output_coord_type) {
  case CIRS:
    ConvertToCIRS(&local_48,this,jd,longitude,latitude,elevation_m,pressure_hPa,temperature_celsius,
                  relative_humidity,dut1,xp,yp,wavelength_um);
    operator=(__return_storage_ptr__,&local_48);
    break;
  case ICRS:
    ConvertToICRS(&local_48,this,jd,longitude,latitude,elevation_m,pressure_hPa,temperature_celsius,
                  relative_humidity,dut1,xp,yp,wavelength_um);
    operator=(__return_storage_ptr__,&local_48);
    break;
  case GALACTIC:
    ConvertToGalactic(&local_48,this,jd,longitude,latitude,elevation_m,pressure_hPa,
                      temperature_celsius,relative_humidity,dut1,xp,yp,wavelength_um);
    operator=(__return_storage_ptr__,&local_48);
    break;
  case OBSERVED:
    ConvertToObserved(&local_48,this,jd,longitude,latitude,elevation_m,pressure_hPa,
                      temperature_celsius,relative_humidity,dut1,xp,yp,wavelength_um);
    operator=(__return_storage_ptr__,&local_48);
    break;
  default:
    goto switchD_00124a2a_default;
  }
  ~CECoordinates(&local_48);
switchD_00124a2a_default:
  return __return_storage_ptr__;
}

Assistant:

CECoordinates CECoordinates::ConvertTo(CECoordinateType output_coord_type,
                                       double jd,
                                       double longitude,
                                       double latitude,
                                       double elevation_m,
                                       double pressure_hPa,
                                       double temperature_celsius,
                                       double relative_humidity,
                                       double dut1,
                                       double xp, double yp,
                                       double wavelength_um)
{
    // Create return coordinate object
    CECoordinates out_coord;

    // Do conversion to CIRS
    if (output_coord_type == CECoordinateType::CIRS) {
        out_coord = ConvertToCIRS(jd, longitude, latitude,
                                  elevation_m, pressure_hPa,
                                  temperature_celsius, relative_humidity,
                                  dut1, xp, yp, wavelength_um) ;
    } else if (output_coord_type == CECoordinateType::ICRS) {
        out_coord = ConvertToICRS(jd, longitude, latitude,
                                  elevation_m, pressure_hPa,
                                  temperature_celsius, relative_humidity,
                                  dut1, xp, yp, wavelength_um) ;
    } else if (output_coord_type == CECoordinateType::GALACTIC) {
        out_coord = ConvertToGalactic(jd, longitude, latitude,
                                      elevation_m, pressure_hPa,
                                      temperature_celsius, relative_humidity,
                                      dut1, xp, yp, wavelength_um) ;
    } else if (output_coord_type == CECoordinateType::OBSERVED) {
        out_coord = ConvertToObserved(jd, longitude, latitude,
                                      elevation_m, pressure_hPa,
                                      temperature_celsius, relative_humidity,
                                      dut1, xp, yp, wavelength_um) ;
    }

    return out_coord;
}